

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parents.h
# Opt level: O0

void __thiscall wasm::Parents::~Parents(Parents *this)

{
  Parents *this_local;
  
  Inner::~Inner(&this->inner);
  return;
}

Assistant:

Parents(Expression* expr) { inner.walk(expr); }